

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
MultiBodyInplaceSolverIslandCallback::setup
          (MultiBodyInplaceSolverIslandCallback *this,btContactSolverInfo *solverInfo,
          btTypedConstraint **sortedConstraints,int numConstraints,
          btMultiBodyConstraint **sortedMultiBodyConstraints,int numMultiBodyConstraints,
          btIDebugDraw *debugDrawer)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  btCollisionObject **in_stack_ffffffffffffffc0;
  btMultiBodyConstraint **fillData;
  int newsize;
  undefined4 in_stack_ffffffffffffffd0;
  
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  *(undefined8 *)(in_RDI + 0x18) = in_R8;
  *(undefined4 *)(in_RDI + 0x20) = in_R9D;
  *(undefined8 *)(in_RDI + 0x28) = in_RDX;
  *(undefined4 *)(in_RDI + 0x30) = in_ECX;
  *(undefined8 *)(in_RDI + 0x38) = in_stack_00000008;
  newsize = 0;
  btAlignedObjectArray<btCollisionObject_*>::resize
            ((btAlignedObjectArray<btCollisionObject_*> *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0)
             ,0,in_stack_ffffffffffffffc0);
  fillData = (btMultiBodyConstraint **)0x0;
  btAlignedObjectArray<btPersistentManifold_*>::resize
            ((btAlignedObjectArray<btPersistentManifold_*> *)
             CONCAT44(in_R9D,in_stack_ffffffffffffffd0),newsize,(btPersistentManifold **)0x0);
  btAlignedObjectArray<btTypedConstraint_*>::resize
            ((btAlignedObjectArray<btTypedConstraint_*> *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0)
             ,newsize,(btTypedConstraint **)fillData);
  btAlignedObjectArray<btMultiBodyConstraint_*>::resize
            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)
             CONCAT44(in_R9D,in_stack_ffffffffffffffd0),newsize,fillData);
  return;
}

Assistant:

SIMD_FORCE_INLINE void setup ( btContactSolverInfo* solverInfo, btTypedConstraint** sortedConstraints, int numConstraints, btMultiBodyConstraint** sortedMultiBodyConstraints,	int	numMultiBodyConstraints,	btIDebugDraw* debugDrawer)
	{
		btAssert(solverInfo);
		m_solverInfo = solverInfo;

		m_multiBodySortedConstraints = sortedMultiBodyConstraints;
		m_numMultiBodyConstraints = numMultiBodyConstraints;
		m_sortedConstraints = sortedConstraints;
		m_numConstraints = numConstraints;

		m_debugDrawer = debugDrawer;
		m_bodies.resize (0);
		m_manifolds.resize (0);
		m_constraints.resize (0);
		m_multiBodyConstraints.resize(0);
	}